

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

uint16_t av1_setup_interp_filter_search_mask(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  DUAL_FILTER_TYPE filt_type;
  int filter_score;
  int last_score;
  InterpFilter ifilter_1;
  int ref_total_total;
  InterpFilter ifilter;
  MV_REFERENCE_FRAME ref;
  uint16_t mask;
  int ref_total [8];
  AV1_COMMON *cm;
  InterpFilter IVar4;
  int in_stack_ffffffffffffffa4;
  MV_REFERENCE_FRAME MVar5;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  byte local_41;
  byte local_3c;
  char local_3b;
  uint16_t local_3a;
  int local_38 [4];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  uint16_t local_2;
  
  local_18 = in_RDI + 0x3bf80;
  local_10 = in_RDI;
  memset(local_38,0,0x20);
  local_3a = 0x1ff;
  if ((*(char *)(local_10 + 0x9d4c1) == '\0') || ((*(byte *)(local_10 + 0x42d7a) & 1) != 0)) {
    local_2 = 0x1ff;
  }
  else {
    for (local_3b = '\x01'; local_3b < '\b'; local_3b = local_3b + '\x01') {
      for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
        iVar1 = get_interp_filter_selected
                          ((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffffa4 >> 0x18),
                           (InterpFilter)((uint)in_stack_ffffffffffffffa4 >> 0x10));
        local_38[local_3b] = iVar1 + local_38[local_3b];
      }
    }
    for (local_41 = 0; local_41 < 3; local_41 = local_41 + 1) {
      MVar5 = (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffffa4 >> 0x18);
      IVar4 = (InterpFilter)((uint)in_stack_ffffffffffffffa4 >> 0x10);
      iVar1 = get_interp_filter_selected
                        ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                         ,MVar5,IVar4);
      if ((local_38[1] != 0) && (iVar1 * 0x1e <= local_38[1])) {
        iVar1 = get_interp_filter_selected
                          ((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),MVar5,IVar4
                          );
        iVar2 = get_interp_filter_selected
                          ((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),MVar5,IVar4
                          );
        iVar3 = get_interp_filter_selected
                          ((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),MVar5,IVar4
                          );
        in_stack_ffffffffffffffa4 = iVar1 * 0x14 + iVar2 * 0x14 + iVar3 * 0x14;
        MVar5 = (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffffa4 >> 0x18);
        IVar4 = (InterpFilter)((uint)in_stack_ffffffffffffffa4 >> 0x10);
        iVar1 = get_interp_filter_selected
                          ((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),MVar5,IVar4
                          );
        in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa4 + iVar1 * 10;
        iVar1 = get_interp_filter_selected
                          ((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),MVar5,IVar4
                          );
        in_stack_ffffffffffffffac = in_stack_ffffffffffffffa8 + iVar1 * 10;
        iVar1 = get_interp_filter_selected
                          ((AV1_COMMON *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),MVar5,IVar4
                          );
        if (in_stack_ffffffffffffffac + iVar1 * 10 <
            local_38[2] + local_38[3] + local_28 + local_24 + local_20 + local_1c) {
          reset_interp_filter_allowed_mask(&local_3a,local_41 * '\x04');
        }
      }
    }
    local_2 = local_3a;
  }
  return local_2;
}

Assistant:

uint16_t av1_setup_interp_filter_search_mask(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  int ref_total[REF_FRAMES] = { 0 };
  uint16_t mask = ALLOW_ALL_INTERP_FILT_MASK;

  if (cpi->last_frame_type == KEY_FRAME || cpi->refresh_frame.alt_ref_frame)
    return mask;

  for (MV_REFERENCE_FRAME ref = LAST_FRAME; ref <= ALTREF_FRAME; ++ref) {
    for (InterpFilter ifilter = EIGHTTAP_REGULAR; ifilter <= MULTITAP_SHARP;
         ++ifilter) {
      ref_total[ref] += get_interp_filter_selected(cm, ref, ifilter);
    }
  }
  int ref_total_total = (ref_total[LAST2_FRAME] + ref_total[LAST3_FRAME] +
                         ref_total[GOLDEN_FRAME] + ref_total[BWDREF_FRAME] +
                         ref_total[ALTREF2_FRAME] + ref_total[ALTREF_FRAME]);

  for (InterpFilter ifilter = EIGHTTAP_REGULAR; ifilter <= MULTITAP_SHARP;
       ++ifilter) {
    int last_score = get_interp_filter_selected(cm, LAST_FRAME, ifilter) * 30;
    if (ref_total[LAST_FRAME] && last_score <= ref_total[LAST_FRAME]) {
      int filter_score =
          get_interp_filter_selected(cm, LAST2_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, LAST3_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, GOLDEN_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, BWDREF_FRAME, ifilter) * 10 +
          get_interp_filter_selected(cm, ALTREF2_FRAME, ifilter) * 10 +
          get_interp_filter_selected(cm, ALTREF_FRAME, ifilter) * 10;
      if (filter_score < ref_total_total) {
        DUAL_FILTER_TYPE filt_type = ifilter + SWITCHABLE_FILTERS * ifilter;
        reset_interp_filter_allowed_mask(&mask, filt_type);
      }
    }
  }
  return mask;
}